

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cpp
# Opt level: O2

QpVector * __thiscall
Basis::ftran(QpVector *__return_storage_ptr__,Basis *this,QpVector *rhs,bool buffer,HighsInt q)

{
  pointer piVar1;
  pointer pdVar2;
  HVector *pHVar3;
  long lVar4;
  HVector rhs_hvec;
  HVectorBase<double> HStack_d8;
  
  pHVar3 = vec2hvec(this,rhs);
  HVectorBase<double>::HVectorBase(&HStack_d8,pHVar3);
  HFactor::ftranCall(&this->basisfactor,&HStack_d8,1.0,(HighsTimerClock *)0x0);
  if (buffer) {
    HVectorBase<double>::copy<double>(&this->col_aq,&HStack_d8);
    piVar1 = (this->col_aq).packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (this->col_aq).packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar4 = 0; lVar4 < HStack_d8.packCount; lVar4 = lVar4 + 1) {
      piVar1[lVar4] =
           HStack_d8.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar4];
      pdVar2[lVar4] =
           HStack_d8.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar4];
    }
    (this->col_aq).packCount = HStack_d8.packCount;
    (this->col_aq).packFlag = HStack_d8.packFlag;
    this->buffered_q = q;
  }
  hvec2vec(__return_storage_ptr__,this,&HStack_d8);
  HVectorBase<double>::~HVectorBase(&HStack_d8);
  return __return_storage_ptr__;
}

Assistant:

QpVector Basis::ftran(const QpVector& rhs, bool buffer, HighsInt q) {
  HVector rhs_hvec = vec2hvec(rhs);
  basisfactor.ftranCall(rhs_hvec, 1.0);
  if (buffer) {
    col_aq.copy(&rhs_hvec);
    for (HighsInt i = 0; i < rhs_hvec.packCount; i++) {
      col_aq.packIndex[i] = rhs_hvec.packIndex[i];
      col_aq.packValue[i] = rhs_hvec.packValue[i];
    }
    col_aq.packCount = rhs_hvec.packCount;
    col_aq.packFlag = rhs_hvec.packFlag;
    buffered_q = q;
  }
  return hvec2vec(rhs_hvec);
}